

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.c
# Opt level: O0

int nn_lb_send(nn_lb *self,nn_msg *msg,nn_pipe **to)

{
  FILE *__stream;
  nn_list_item *pnVar1;
  char *pcVar2;
  nn_priolist *in_RDX;
  nn_pipe *in_RSI;
  nn_priolist *in_RDI;
  nn_pipe *pipe;
  int rc;
  uint local_4;
  
  pnVar1 = (nn_list_item *)nn_priolist_getpipe(in_RDI);
  if (pnVar1 == (nn_list_item *)0x0) {
    local_4 = 0xfffffff5;
  }
  else {
    local_4 = nn_pipe_send(in_RSI,(nn_msg *)in_RDX);
    if ((int)local_4 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-local_4,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/utils/lb.c"
              ,0x4e);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_priolist_advance(in_RDX,local_4);
    if (in_RDX != (nn_priolist *)0x0) {
      in_RDX->slots[0].pipes.first = pnVar1;
    }
    local_4 = local_4 & 0xfffffffe;
  }
  return local_4;
}

Assistant:

int nn_lb_send (struct nn_lb *self, struct nn_msg *msg, struct nn_pipe **to)
{
    int rc;
    struct nn_pipe *pipe;

    /*  Pipe is NULL only when there are no avialable pipes. */
    pipe = nn_priolist_getpipe (&self->priolist);
    if (nn_slow (!pipe))
        return -EAGAIN;

    /*  Send the messsage. */
    rc = nn_pipe_send (pipe, msg);
    errnum_assert (rc >= 0, -rc);

    /*  Move to the next pipe. */
    nn_priolist_advance (&self->priolist, rc & NN_PIPE_RELEASE);

    if (to != NULL)
        *to = pipe;

    return rc & ~NN_PIPE_RELEASE;
}